

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope::addOrChangeBinding
          (Scope *this,XMLCh *prefix,XMLCh *uri,MemoryManager *manager)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar1;
  void *pvVar2;
  char16_t *pcVar3;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> uriEnumer;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> preEnumer;
  
  if (this->fUriHash == (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
    pRVar1 = (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
    RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOf(pRVar1,10,false,manager);
    this->fPrefixHash = pRVar1;
    pRVar1 = (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
    RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOf(pRVar1,10,false,manager);
    this->fUriHash = pRVar1;
    if (this->fBaseScopeWithBindings != (Scope *)0x0) {
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOfEnumerator
                (&preEnumer,this->fBaseScopeWithBindings->fPrefixHash,false,manager);
      while ((preEnumer.fCurElem != (RefHashTableBucketElem<char16_t> *)0x0 ||
             (preEnumer.fCurHash != (preEnumer.fToEnum)->fHashModulus))) {
        pvVar2 = RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::nextElementKey
                           (&preEnumer);
        pcVar3 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (this->fBaseScopeWithBindings->fPrefixHash,pvVar2);
        RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fPrefixHash,pvVar2,pcVar3);
      }
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOfEnumerator
                (&uriEnumer,this->fBaseScopeWithBindings->fUriHash,false,manager);
      while ((uriEnumer.fCurElem != (RefHashTableBucketElem<char16_t> *)0x0 ||
             (uriEnumer.fCurHash != (uriEnumer.fToEnum)->fHashModulus))) {
        pvVar2 = RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::nextElementKey
                           (&uriEnumer);
        pcVar3 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (this->fBaseScopeWithBindings->fUriHash,pvVar2);
        RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fUriHash,pvVar2,pcVar3);
      }
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::~RefHashTableOfEnumerator
                (&uriEnumer);
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::~RefHashTableOfEnumerator
                (&preEnumer);
    }
  }
  pcVar3 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this->fPrefixHash,prefix);
  if (pcVar3 != (char16_t *)0x0) {
    RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::removeKey(this->fUriHash,pcVar3);
  }
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fPrefixHash,prefix,uri);
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fUriHash,uri,prefix);
  return;
}

Assistant:

void DOMNormalizer::InScopeNamespaces::Scope::addOrChangeBinding(const XMLCh *prefix, const XMLCh *uri,
                                                                 MemoryManager* const manager) {
    //initialize and copy forward now we need to
    if(!fUriHash) {
        fPrefixHash = new (manager) RefHashTableOf<XMLCh>(10, (bool) false, manager);
        fUriHash = new (manager) RefHashTableOf<XMLCh>(10, (bool) false, manager);

        if(fBaseScopeWithBindings) {
            RefHashTableOfEnumerator<XMLCh> preEnumer(fBaseScopeWithBindings->fPrefixHash, false, manager);
            while(preEnumer.hasMoreElements()) {
                const XMLCh* prefix = (XMLCh*) preEnumer.nextElementKey();
                const XMLCh* uri  = fBaseScopeWithBindings->fPrefixHash->get((void*)prefix);

                //have to cast here because otherwise we have delete problems under windows :(
                fPrefixHash->put((void *)prefix, (XMLCh*)uri);
            }

            RefHashTableOfEnumerator<XMLCh> uriEnumer(fBaseScopeWithBindings->fUriHash, false, manager);
            while(uriEnumer.hasMoreElements()) {
                const XMLCh* uri = (XMLCh*) uriEnumer.nextElementKey();
                const XMLCh* prefix  = fBaseScopeWithBindings->fUriHash->get((void*)uri);

                //have to cast here because otherwise we have delete problems under windows :(
                fUriHash->put((void *)uri, (XMLCh*)prefix);
            }
        }
    }

    const XMLCh *oldUri = fPrefixHash->get(prefix);
    if(oldUri) {
        fUriHash->removeKey(oldUri);
    }

    fPrefixHash->put((void *)prefix, (XMLCh*)uri);
    fUriHash->put((void *)uri, (XMLCh*)prefix);
}